

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

void google::protobuf::util::MatchIndicesPostProcessorForSmartList
               (vector<int,_std::allocator<int>_> *match_list1,
               vector<int,_std::allocator<int>_> *match_list2)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  piVar2 = (match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    lVar7 = 0;
    iVar8 = -1;
    do {
      iVar1 = piVar2[lVar7];
      uVar5 = (ulong)iVar1;
      iVar4 = iVar8;
      if ((-1 < (long)uVar5) && (iVar4 = iVar1, iVar1 <= iVar8 && -1 < iVar8)) {
        piVar3 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar5) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar5);
        }
        piVar3[uVar5] = -1;
        piVar2[lVar7] = -1;
        iVar4 = iVar8;
      }
      iVar8 = iVar4;
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  return;
}

Assistant:

void MatchIndicesPostProcessorForSmartList(std::vector<int>* match_list1,
                                           std::vector<int>* match_list2) {
  int last_matched_index = -1;
  for (size_t i = 0; i < match_list1->size(); ++i) {
    if (match_list1->at(i) < 0) {
      continue;
    }
    if (last_matched_index < 0 || match_list1->at(i) > last_matched_index) {
      last_matched_index = match_list1->at(i);
    } else {
      match_list2->at(match_list1->at(i)) = -1;
      match_list1->at(i) = -1;
    }
  }
}